

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionShapePolyline::UpdateProfile(ChBeamSectionShapePolyline *this)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize((vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
            *)(this + 0x20),(*(long *)(this + 0x10) - *(long *)(this + 8)) / 0x18);
  lVar7 = *(long *)(this + 8);
  uVar10 = 0;
  while (uVar10 < (ulong)((*(long *)(this + 0x10) - lVar7) / 0x18)) {
    lVar9 = uVar10 * 0x18;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
               (*(long *)(this + 0x20) + lVar9),
               (*(long *)(lVar7 + 8 + lVar9) - *(long *)(lVar7 + lVar9)) / 0x18);
    lVar7 = *(long *)(this + 8);
    lVar1 = *(long *)(lVar7 + lVar9);
    lVar5 = *(long *)(lVar7 + 8 + lVar9) - lVar1;
    lVar2 = *(long *)(this + 0x20);
    lVar6 = 0;
    uVar8 = 1;
    while (uVar8 < lVar5 / 0x18 - 1U) {
      uVar8 = uVar8 + 1;
      dVar3 = *(double *)(lVar1 + 0x40 + lVar6) - *(double *)(lVar1 + 0x10 + lVar6);
      dVar4 = *(double *)(lVar1 + 0x38 + lVar6) - *(double *)(lVar1 + 8 + lVar6);
      auVar17._0_8_ = -dVar3;
      auVar17._8_8_ = 0x8000000000000000;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar4;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar3 * dVar3;
      auVar13 = vfmadd231sd_fma(auVar23,auVar11,auVar11);
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar4;
      auVar14 = vunpcklpd_avx(auVar17,auVar12);
      auVar18._8_8_ = auVar13._0_8_;
      auVar18._0_8_ = auVar13._0_8_;
      auVar13 = vdivpd_avx(auVar14,auVar18);
      *(undefined1 (*) [16])(*(long *)(lVar9 + lVar2) + 0x20 + lVar6) = auVar13;
      lVar6 = lVar6 + 0x18;
    }
    lVar2 = *(long *)(lVar9 + lVar2);
    uVar10 = uVar10 + 1;
    dVar3 = *(double *)(lVar1 + 0x28) - *(double *)(lVar1 + 0x10);
    dVar4 = *(double *)(lVar1 + 0x20) - *(double *)(lVar1 + 8);
    auVar19._0_8_ = -dVar3;
    auVar19._8_8_ = 0x8000000000000000;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar4;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar3 * dVar3;
    auVar13 = vfmadd231sd_fma(auVar24,auVar13,auVar13);
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar4;
    auVar14 = vunpcklpd_avx(auVar19,auVar14);
    auVar20._8_8_ = auVar13._0_8_;
    auVar20._0_8_ = auVar13._0_8_;
    auVar13 = vdivpd_avx(auVar14,auVar20);
    *(undefined1 (*) [16])(lVar2 + 8) = auVar13;
    dVar3 = *(double *)(lVar1 + -8 + lVar5) - *(double *)(lVar1 + -0x20 + lVar5);
    dVar4 = *(double *)(lVar1 + -0x10 + lVar5) - *(double *)(lVar1 + -0x28 + lVar5);
    auVar21._0_8_ = -dVar3;
    auVar21._8_8_ = 0x8000000000000000;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar4;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar3 * dVar3;
    auVar13 = vfmadd231sd_fma(auVar25,auVar15,auVar15);
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar4;
    auVar14 = vunpcklpd_avx(auVar21,auVar16);
    auVar22._8_8_ = auVar13._0_8_;
    auVar22._0_8_ = auVar13._0_8_;
    auVar13 = vdivpd_avx(auVar14,auVar22);
    *(undefined1 (*) [16])(lVar2 + -0x10 + lVar5) = auVar13;
  }
  return;
}

Assistant:

void ChBeamSectionShapePolyline::UpdateProfile() {
    ml_normals.resize(ml_points.size());

    for (int il = 0; il < ml_points.size(); ++il) {
        ml_normals[il].resize(ml_points[il].size());
        double dy, dz, len;
        for (int ip = 1; ip < ml_points[il].size() - 1; ++ip) {
            dy = ml_points[il][ip + 1].y() - ml_points[il][ip - 1].y();
            dz = ml_points[il][ip + 1].z() - ml_points[il][ip - 1].z();
            len = sqrt(dy * dy + dz * dz);
            ml_normals[il][ip].y() = -dz / len;
            ml_normals[il][ip].z() = dy / len;
        }
        dy = ml_points[il][1].y() - ml_points[il][0].y();
        dz = ml_points[il][1].z() - ml_points[il][0].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][0].y() = -dz / len;
        ml_normals[il][0].z() = dy / len;
        dy = ml_points[il][ml_points[il].size() - 1].y() - ml_points[il][ml_points[il].size() - 2].y();
        dz = ml_points[il][ml_points[il].size() - 1].z() - ml_points[il][ml_points[il].size() - 2].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][ml_points[il].size() - 1].y() = -dz / len;
        ml_normals[il][ml_points[il].size() - 1].z() = dy / len;
    }
}